

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void av1_read_sequence_header(AV1_COMMON *cm,aom_read_bit_buffer *rb,SequenceHeader *seq_params)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *in_RDX;
  long in_RDI;
  int max_frame_height;
  int max_frame_width;
  int num_bits_height;
  int num_bits_width;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
  iVar2 = aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
  iVar3 = aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
  iVar3 = iVar3 + 1;
  iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
  iVar4 = iVar4 + 1;
  *in_RDX = iVar1 + 1;
  in_RDX[1] = iVar2 + 1;
  in_RDX[2] = iVar3;
  in_RDX[3] = iVar4;
  if (*(char *)((long)in_RDX + 0x3a) == '\0') {
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
    *(char *)(in_RDX + 4) = (char)iVar1;
  }
  else {
    *(undefined1 *)(in_RDX + 4) = 0;
  }
  if ((char)in_RDX[4] != '\0') {
    iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                in_stack_ffffffffffffffcc);
    in_RDX[6] = iVar1 + 2;
    iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                in_stack_ffffffffffffffcc);
    in_RDX[5] = iVar1 + in_RDX[6] + 1;
    if (0x10 < in_RDX[5]) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_CORRUPT_FRAME,
                         "Invalid frame_id_length");
    }
  }
  setup_sb_size((SequenceHeader *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                (aom_read_bit_buffer *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
               );
  iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
  *(char *)(in_RDX + 0xf) = (char)iVar1;
  iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
  *(char *)((long)in_RDX + 0x3d) = (char)iVar1;
  if (*(char *)((long)in_RDX + 0x3a) == '\0') {
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
    *(char *)((long)in_RDX + 0x3e) = (char)iVar1;
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
    *(char *)((long)in_RDX + 0x3f) = (char)iVar1;
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
    *(char *)((long)in_RDX + 0x41) = (char)iVar1;
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
    *(char *)(in_RDX + 0x10) = (char)iVar1;
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
    in_RDX[10] = iVar1;
    if (in_RDX[10] == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
    }
    in_RDX[0xc] = iVar1;
    if (in_RDX[10] == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
    }
    in_RDX[0xd] = iVar2;
    iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
    if (iVar5 == 0) {
      iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
      *(char *)(in_RDX + 0xe) = (char)iVar5;
    }
    else {
      *(undefined1 *)(in_RDX + 0xe) = 2;
    }
    if ((char)in_RDX[0xe] == '\0') {
      *(undefined1 *)((long)in_RDX + 0x3b) = 2;
    }
    else {
      iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
      if (iVar5 == 0) {
        iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
        *(char *)((long)in_RDX + 0x3b) = (char)iVar5;
      }
      else {
        *(undefined1 *)((long)in_RDX + 0x3b) = 2;
      }
    }
    if (in_RDX[10] == 0) {
      iVar1 = -1;
    }
    else {
      iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(iVar1,iVar2),
                                  in_stack_ffffffffffffffcc);
    }
    in_RDX[0xb] = iVar1;
  }
  else {
    *(undefined1 *)((long)in_RDX + 0x3e) = 0;
    *(undefined1 *)((long)in_RDX + 0x3f) = 0;
    *(undefined1 *)((long)in_RDX + 0x41) = 0;
    *(undefined1 *)(in_RDX + 0x10) = 0;
    in_RDX[10] = 0;
    in_RDX[0xc] = 0;
    in_RDX[0xd] = 0;
    *(undefined1 *)(in_RDX + 0xe) = 2;
    *(undefined1 *)((long)in_RDX + 0x3b) = 2;
    in_RDX[0xb] = -1;
  }
  iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
  *(char *)((long)in_RDX + 0x42) = (char)iVar1;
  iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
  *(char *)((long)in_RDX + 0x43) = (char)iVar1;
  iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar3,iVar4));
  *(char *)(in_RDX + 0x11) = (char)iVar1;
  return;
}

Assistant:

void av1_read_sequence_header(AV1_COMMON *cm, struct aom_read_bit_buffer *rb,
                              SequenceHeader *seq_params) {
  const int num_bits_width = aom_rb_read_literal(rb, 4) + 1;
  const int num_bits_height = aom_rb_read_literal(rb, 4) + 1;
  const int max_frame_width = aom_rb_read_literal(rb, num_bits_width) + 1;
  const int max_frame_height = aom_rb_read_literal(rb, num_bits_height) + 1;

  seq_params->num_bits_width = num_bits_width;
  seq_params->num_bits_height = num_bits_height;
  seq_params->max_frame_width = max_frame_width;
  seq_params->max_frame_height = max_frame_height;

  if (seq_params->reduced_still_picture_hdr) {
    seq_params->frame_id_numbers_present_flag = 0;
  } else {
    seq_params->frame_id_numbers_present_flag = aom_rb_read_bit(rb);
  }
  if (seq_params->frame_id_numbers_present_flag) {
    // We must always have delta_frame_id_length < frame_id_length,
    // in order for a frame to be referenced with a unique delta.
    // Avoid wasting bits by using a coding that enforces this restriction.
    seq_params->delta_frame_id_length = aom_rb_read_literal(rb, 4) + 2;
    seq_params->frame_id_length =
        aom_rb_read_literal(rb, 3) + seq_params->delta_frame_id_length + 1;
    if (seq_params->frame_id_length > 16)
      aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                         "Invalid frame_id_length");
  }

  setup_sb_size(seq_params, rb);

  seq_params->enable_filter_intra = aom_rb_read_bit(rb);
  seq_params->enable_intra_edge_filter = aom_rb_read_bit(rb);

  if (seq_params->reduced_still_picture_hdr) {
    seq_params->enable_interintra_compound = 0;
    seq_params->enable_masked_compound = 0;
    seq_params->enable_warped_motion = 0;
    seq_params->enable_dual_filter = 0;
    seq_params->order_hint_info.enable_order_hint = 0;
    seq_params->order_hint_info.enable_dist_wtd_comp = 0;
    seq_params->order_hint_info.enable_ref_frame_mvs = 0;
    seq_params->force_screen_content_tools = 2;  // SELECT_SCREEN_CONTENT_TOOLS
    seq_params->force_integer_mv = 2;            // SELECT_INTEGER_MV
    seq_params->order_hint_info.order_hint_bits_minus_1 = -1;
  } else {
    seq_params->enable_interintra_compound = aom_rb_read_bit(rb);
    seq_params->enable_masked_compound = aom_rb_read_bit(rb);
    seq_params->enable_warped_motion = aom_rb_read_bit(rb);
    seq_params->enable_dual_filter = aom_rb_read_bit(rb);

    seq_params->order_hint_info.enable_order_hint = aom_rb_read_bit(rb);
    seq_params->order_hint_info.enable_dist_wtd_comp =
        seq_params->order_hint_info.enable_order_hint ? aom_rb_read_bit(rb) : 0;
    seq_params->order_hint_info.enable_ref_frame_mvs =
        seq_params->order_hint_info.enable_order_hint ? aom_rb_read_bit(rb) : 0;

    if (aom_rb_read_bit(rb)) {
      seq_params->force_screen_content_tools =
          2;  // SELECT_SCREEN_CONTENT_TOOLS
    } else {
      seq_params->force_screen_content_tools = aom_rb_read_bit(rb);
    }

    if (seq_params->force_screen_content_tools > 0) {
      if (aom_rb_read_bit(rb)) {
        seq_params->force_integer_mv = 2;  // SELECT_INTEGER_MV
      } else {
        seq_params->force_integer_mv = aom_rb_read_bit(rb);
      }
    } else {
      seq_params->force_integer_mv = 2;  // SELECT_INTEGER_MV
    }
    seq_params->order_hint_info.order_hint_bits_minus_1 =
        seq_params->order_hint_info.enable_order_hint
            ? aom_rb_read_literal(rb, 3)
            : -1;
  }

  seq_params->enable_superres = aom_rb_read_bit(rb);
  seq_params->enable_cdef = aom_rb_read_bit(rb);
  seq_params->enable_restoration = aom_rb_read_bit(rb);
}